

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

aiNode * __thiscall aiNode::FindNode(aiNode *this,char *name)

{
  uint uVar1;
  aiNode **ppaVar2;
  int iVar3;
  aiNode *paVar4;
  ulong uVar5;
  
  if (name != (char *)0x0) {
    iVar3 = strcmp((this->mName).data,name);
    if (iVar3 == 0) {
      return this;
    }
    uVar1 = this->mNumChildren;
    if ((ulong)uVar1 != 0) {
      ppaVar2 = this->mChildren;
      uVar5 = 0;
      do {
        paVar4 = FindNode(ppaVar2[uVar5],name);
        if (paVar4 != (aiNode *)0x0) {
          return paVar4;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      return (aiNode *)0x0;
    }
  }
  return (aiNode *)0x0;
}

Assistant:

const aiNode *aiNode::FindNode(const char* name) const {
    if (nullptr == name) {
        return nullptr;
    }
    if (!::strcmp(mName.data, name)) {
        return this;
    }
    for (unsigned int i = 0; i < mNumChildren; ++i) {
        const aiNode* const p = mChildren[i]->FindNode(name);
        if (p) {
            return p;
        }
    }
    // there is definitely no sub-node with this name
    return nullptr;
}